

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathPow(Parser *this)

{
  string *__return_storage_ptr__;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  runtime_error *prVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar3;
  shared_ptr<minja::Expression> right;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  
  parseMathPlusMinus(this);
  if ((this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Expected left side of \'math pow\' expression");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __return_storage_ptr__ = (string *)(local_60 + 0x10);
  while( true ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&right,"**",(allocator<char> *)local_60);
    consumeToken(__return_storage_ptr__,in_RSI,(string *)&right,Strip);
    _Var1._M_pi = local_48[0]._M_pi;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&right);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      sVar3.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar3.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<minja::Expression>)
             sVar3.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parseMathPlusMinus((Parser *)&right);
    if (right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) break;
    get_location((Location *)__return_storage_ptr__,in_RSI);
    std::
    make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op>
              ((Location *)local_60,(shared_ptr<minja::Expression> *)__return_storage_ptr__,
               (shared_ptr<minja::Expression> *)this,(Op *)&right);
    std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<minja::BinaryOpExpr,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Expected right side of \'math pow\' expression");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseMathPow() {
        auto left = parseMathPlusMinus();
        if (!left) throw std::runtime_error("Expected left side of 'math pow' expression");

        while (!consumeToken("**").empty()) {
            auto right = parseMathPlusMinus();
            if (!right) throw std::runtime_error("Expected right side of 'math pow' expression");
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), BinaryOpExpr::Op::MulMul);
        }
        return left;
    }